

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

void __thiscall
cmDependsFortran::cmDependsFortran(cmDependsFortran *this,cmLocalUnixMakefileGenerator3 *lg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  pointer pbVar5;
  cmDependsFortranInternals *pcVar6;
  long lVar7;
  _Base_ptr p_Var8;
  pointer *__ptr;
  pointer pbVar9;
  string def;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  definitions;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  string *local_c8;
  string *local_c0;
  string *local_b8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_> *local_88;
  cmDependsFortran *local_80;
  cmMakefile *local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  cmDepends::cmDepends(&this->super_cmDepends,lg,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsFortran_00954210;
  local_d0 = &(this->SourceFile).field_2;
  (this->SourceFile)._M_dataplus._M_p = (pointer)local_d0;
  (this->SourceFile)._M_string_length = 0;
  (this->SourceFile).field_2._M_local_buf[0] = '\0';
  local_b8 = (string *)&this->CompilerId;
  local_d8 = &(this->CompilerId).field_2;
  (this->CompilerId)._M_dataplus._M_p = (pointer)local_d8;
  (this->CompilerId)._M_string_length = 0;
  (this->CompilerId).field_2._M_local_buf[0] = '\0';
  local_c0 = (string *)&this->SModSep;
  local_e0 = &(this->SModSep).field_2;
  (this->SModSep)._M_dataplus._M_p = (pointer)local_e0;
  (this->SModSep)._M_string_length = 0;
  (this->SModSep).field_2._M_local_buf[0] = '\0';
  local_c8 = (string *)&this->SModExt;
  local_e8 = &(this->SModExt).field_2;
  (this->SModExt)._M_dataplus._M_p = (pointer)local_e8;
  (this->SModExt)._M_string_length = 0;
  (this->SModExt).field_2._M_local_buf[0] = '\0';
  local_b0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->PPDefinitions;
  p_Var2 = &(this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = this;
  pcVar6 = (cmDependsFortranInternals *)operator_new(0x90);
  local_88 = &this->Internal;
  p_Var8 = (_Base_ptr)((long)&(pcVar6->TargetProvides)._M_t + 8);
  (((_Rb_tree_header *)((long)&(pcVar6->TargetProvides)._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(pcVar6->TargetProvides)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(pcVar6->TargetProvides)._M_t + 0x18) = p_Var8;
  *(_Base_ptr *)((long)&(pcVar6->TargetProvides)._M_t + 0x20) = p_Var8;
  *(size_t *)((long)&(pcVar6->TargetProvides)._M_t + 0x28) = 0;
  p_Var8 = (_Base_ptr)((long)&(pcVar6->TargetRequires)._M_t + 8);
  (((_Rb_tree_header *)((long)&(pcVar6->TargetRequires)._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(pcVar6->TargetRequires)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(pcVar6->TargetRequires)._M_t + 0x18) = p_Var8;
  *(_Base_ptr *)((long)&(pcVar6->TargetRequires)._M_t + 0x20) = p_Var8;
  *(size_t *)((long)&(pcVar6->TargetRequires)._M_t + 0x28) = 0;
  p_Var8 = (_Base_ptr)((long)&(pcVar6->ObjectInfo)._M_t + 8);
  (((_Rb_tree_header *)((long)&(pcVar6->ObjectInfo)._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(pcVar6->ObjectInfo)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(pcVar6->ObjectInfo)._M_t + 0x18) = p_Var8;
  *(_Base_ptr *)((long)&(pcVar6->ObjectInfo)._M_t + 0x20) = p_Var8;
  *(size_t *)((long)&(pcVar6->ObjectInfo)._M_t + 0x28) = 0;
  (local_88->_M_t).
  super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
  .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl = pcVar6;
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Fortran","");
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
           super_cmLocalGenerator.Makefile;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"CMAKE_TARGET_DEFINITIONS_Fortran","");
  cmMakefile::GetDefExpandList(pcVar3,&local_108,&local_a8,false);
  local_78 = pcVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  pbVar5 = local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar9 = local_a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar4 = (pbVar9->_M_dataplus)._M_p;
      local_108._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar4,pcVar4 + pbVar9->_M_string_length);
      lVar7 = std::__cxx11::string::find((char)&local_108,0x3d);
      if (lVar7 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_108);
        std::__cxx11::string::operator=((string *)&local_108,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>(local_b0,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar5);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"CMAKE_Fortran_COMPILER_ID","");
  pcVar3 = local_78;
  cmMakefile::GetSafeDefinition(local_78,&local_108);
  std::__cxx11::string::_M_assign(local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"CMAKE_Fortran_SUBMODULE_SEP","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_108);
  std::__cxx11::string::_M_assign(local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"CMAKE_Fortran_SUBMODULE_EXT","");
  cmMakefile::GetSafeDefinition(pcVar3,&local_108);
  std::__cxx11::string::_M_assign(local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

cmDependsFortran::cmDependsFortran(cmLocalUnixMakefileGenerator3* lg)
  : cmDepends(lg)
  , Internal(new cmDependsFortranInternals)
{
  // Configure the include file search path.
  this->SetIncludePathFromLanguage("Fortran");

  // Get the list of definitions.
  std::vector<std::string> definitions;
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  mf->GetDefExpandList("CMAKE_TARGET_DEFINITIONS_Fortran", definitions);

  // translate i.e. FOO=BAR to FOO and add it to the list of defined
  // preprocessor symbols
  for (std::string def : definitions) {
    std::string::size_type assignment = def.find('=');
    if (assignment != std::string::npos) {
      def = def.substr(0, assignment);
    }
    this->PPDefinitions.insert(def);
  }

  this->CompilerId = mf->GetSafeDefinition("CMAKE_Fortran_COMPILER_ID");
  this->SModSep = mf->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
  this->SModExt = mf->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
}